

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::Data
          (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *this,
          Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  QWidget **ppQVar4;
  Node<QWidget_*,_QHashDummyValue> *pNVar5;
  Node<QWidget_*,_QHashDummyValue> *pNVar6;
  long in_RSI;
  Span<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar7;
  size_t otherNSpans;
  Node<QWidget_*,_QHashDummyValue> *newNode;
  Node<QWidget_*,_QHashDummyValue> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *this_00;
  QWidget **key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  QWidget **local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  in_RDI->offsets[0x10] = '\0';
  in_RDI->offsets[0x11] = '\0';
  in_RDI->offsets[0x12] = '\0';
  in_RDI->offsets[0x13] = '\0';
  in_RDI->offsets[0x14] = '\0';
  in_RDI->offsets[0x15] = '\0';
  in_RDI->offsets[0x16] = '\0';
  in_RDI->offsets[0x17] = '\0';
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  qMax<unsigned_long>((unsigned_long *)(in_RDI->offsets + 8),&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)(in_RDI->offsets + 0x10) = sVar3;
  RVar7 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)(in_RDI->offsets + 0x20) = RVar7.spans;
  ppQVar4 = (QWidget **)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = ppQVar4;
  for (local_40 = (QWidget **)0x0; local_40 < ppQVar4; local_40 = (QWidget **)((long)local_40 + 1))
  {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::hasNode
                        ((Span<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        pNVar5 = Span<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::findBucket<QWidget*>
                             ((Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)RVar7.spans,
                              key);
        pNVar6 = Bucket::insert((Bucket *)0x5886e7);
        pNVar6->key = pNVar5->key;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }